

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  __m256 afVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  size_t k;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [28];
  bool bVar49;
  int iVar50;
  float *vertices;
  long lVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [32];
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined4 uVar57;
  ulong unaff_R12;
  NodeRef root;
  size_t i_1;
  long lVar58;
  ulong *puVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  undefined8 extraout_XMM1_Qa;
  float fVar84;
  undefined1 auVar73 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 extraout_var [56];
  undefined1 auVar91 [32];
  float fVar95;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar137 [32];
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  undefined1 auVar145 [32];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vuint<4> *v;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  vfloat<8> t;
  vfloat<8> v_1;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2db1;
  RayQueryContext *local_2db0;
  ulong local_2da8;
  ulong local_2da0;
  RayK<8> *local_2d98;
  RTCFilterFunctionNArguments local_2d90;
  undefined1 local_2d60 [8];
  undefined1 auStack_2d58 [8];
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  undefined1 local_2d40 [32];
  BVH *local_2d10;
  Intersectors *local_2d08;
  long local_2d00;
  long local_2cf8;
  Scene *local_2cf0;
  long local_2ce8;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 local_2c10;
  undefined8 uStack_2c08;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2c00;
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [8];
  float fStack_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2a20;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  float local_2900;
  float fStack_28fc;
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined4 uStack_28e4;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2800;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  uint local_2740;
  uint uStack_273c;
  uint uStack_2738;
  uint uStack_2734;
  uint uStack_2730;
  uint uStack_272c;
  uint uStack_2728;
  uint uStack_2724;
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26e0;
  RTCRayQueryContext local_26c0 [4];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26a0;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2640;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar77 [32];
  undefined1 auVar110 [64];
  
  local_2d10 = (BVH *)This->ptr;
  local_2608 = (local_2d10->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar94 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar73 = ZEXT816(0) << 0x40;
      auVar78 = vpcmpeqd_avx2(auVar94,(undefined1  [32])valid_i->field_0);
      auVar94 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar73),5);
      auVar74 = auVar78 & auVar94;
      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0x7f,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar74 >> 0xbf,0) != '\0') ||
          (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar74[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar94,auVar78);
        auVar17 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        local_2c00._0_8_ = *(undefined8 *)ray;
        local_2c00._8_8_ = *(undefined8 *)(ray + 8);
        local_2c00._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2c00._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2c00._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2c00._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2c00._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2c00._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2c00._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2c00._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2c00._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2c00._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2ba0 = *(undefined1 (*) [32])(ray + 0x80);
        local_2b80 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2940._8_4_ = 0x7fffffff;
        local_2940._0_8_ = 0x7fffffff7fffffff;
        local_2940._12_4_ = 0x7fffffff;
        local_2940._16_4_ = 0x7fffffff;
        local_2940._20_4_ = 0x7fffffff;
        local_2940._24_4_ = 0x7fffffff;
        local_2940._28_4_ = 0x7fffffff;
        auVar124._8_4_ = 0x219392ef;
        auVar124._0_8_ = 0x219392ef219392ef;
        auVar124._12_4_ = 0x219392ef;
        auVar124._16_4_ = 0x219392ef;
        auVar124._20_4_ = 0x219392ef;
        auVar124._24_4_ = 0x219392ef;
        auVar124._28_4_ = 0x219392ef;
        auVar133._8_4_ = 0x3f800000;
        auVar133._0_8_ = 0x3f8000003f800000;
        auVar133._12_4_ = 0x3f800000;
        auVar133._16_4_ = 0x3f800000;
        auVar133._20_4_ = 0x3f800000;
        auVar133._24_4_ = 0x3f800000;
        auVar133._28_4_ = 0x3f800000;
        local_2b60 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar101 = vdivps_avx(auVar133,local_2ba0);
        auVar94 = vandps_avx(local_2940,local_2ba0);
        auVar74 = vcmpps_avx(auVar94,auVar124,1);
        auVar94 = vandps_avx(local_2940,local_2b80);
        auVar78 = vcmpps_avx(auVar94,auVar124,1);
        auVar116 = ZEXT3264(auVar78);
        auVar104 = vdivps_avx(auVar133,local_2b80);
        auVar94 = vandps_avx(local_2940,local_2b60);
        auVar77._8_4_ = 0x5d5e0b6b;
        auVar77._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar77._12_4_ = 0x5d5e0b6b;
        auVar77._16_4_ = 0x5d5e0b6b;
        auVar77._20_4_ = 0x5d5e0b6b;
        auVar77._24_4_ = 0x5d5e0b6b;
        auVar77._28_4_ = 0x5d5e0b6b;
        auVar122 = ZEXT3264(auVar77);
        _local_2b40 = vblendvps_avx(auVar101,auVar77,auVar74);
        auVar94 = vcmpps_avx(auVar94,auVar124,1);
        auVar74 = vdivps_avx(auVar133,local_2b60);
        local_2b20 = vblendvps_avx(auVar104,auVar77,auVar78);
        local_2b00 = vblendvps_avx(auVar74,auVar77,auVar94);
        auVar94 = vcmpps_avx(_local_2b40,ZEXT1632(auVar73),1);
        auVar104._8_4_ = 0x10;
        auVar104._0_8_ = 0x1000000010;
        auVar104._12_4_ = 0x10;
        auVar104._16_4_ = 0x10;
        auVar104._20_4_ = 0x10;
        auVar104._24_4_ = 0x10;
        auVar104._28_4_ = 0x10;
        local_2ae0 = vandps_avx(auVar94,auVar104);
        auVar74 = ZEXT1632(auVar73);
        auVar94 = vcmpps_avx(local_2b20,auVar74,5);
        auVar78._8_4_ = 0x20;
        auVar78._0_8_ = 0x2000000020;
        auVar78._12_4_ = 0x20;
        auVar78._16_4_ = 0x20;
        auVar78._20_4_ = 0x20;
        auVar78._24_4_ = 0x20;
        auVar78._28_4_ = 0x20;
        auVar105._8_4_ = 0x30;
        auVar105._0_8_ = 0x3000000030;
        auVar105._12_4_ = 0x30;
        auVar105._16_4_ = 0x30;
        auVar105._20_4_ = 0x30;
        auVar105._24_4_ = 0x30;
        auVar105._28_4_ = 0x30;
        local_2ac0 = vblendvps_avx(auVar105,auVar78,auVar94);
        auVar94 = vcmpps_avx(local_2b00,auVar74,5);
        auVar101._8_4_ = 0x40;
        auVar101._0_8_ = 0x4000000040;
        auVar101._12_4_ = 0x40;
        auVar101._16_4_ = 0x40;
        auVar101._20_4_ = 0x40;
        auVar101._24_4_ = 0x40;
        auVar101._28_4_ = 0x40;
        auVar106._8_4_ = 0x50;
        auVar106._0_8_ = 0x5000000050;
        auVar106._12_4_ = 0x50;
        auVar106._16_4_ = 0x50;
        auVar106._20_4_ = 0x50;
        auVar106._24_4_ = 0x50;
        auVar106._28_4_ = 0x50;
        auVar110 = ZEXT3264(auVar106);
        local_2aa0 = vblendvps_avx(auVar106,auVar101,auVar94);
        auVar94 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar74);
        local_2a40 = vpmovsxwd_avx2(auVar17);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar125 = ZEXT3264(local_1e80);
        local_2a80 = vblendvps_avx(local_1e80,auVar94,local_2a40);
        auVar94 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar74);
        auVar74._8_4_ = 0xff800000;
        auVar74._0_8_ = 0xff800000ff800000;
        auVar74._12_4_ = 0xff800000;
        auVar74._16_4_ = 0xff800000;
        auVar74._20_4_ = 0xff800000;
        auVar74._24_4_ = 0xff800000;
        auVar74._28_4_ = 0xff800000;
        auVar81 = ZEXT3264(auVar74);
        local_2a60 = vblendvps_avx(auVar74,auVar94,local_2a40);
        auVar73 = vpcmpeqd_avx(local_2a60._0_16_,local_2a60._0_16_);
        local_2ce0 = vpmovsxwd_avx2(auVar17 ^ auVar73);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar56 = 5;
        }
        else {
          uVar56 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2d98 = ray + 0x100;
        puVar59 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar53 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2a80;
        auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar135 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_2db0 = context;
        local_2da8 = uVar56;
        local_2d08 = This;
LAB_015b96a1:
        do {
          do {
            root.ptr = puVar59[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_015ba32a;
            puVar59 = puVar59 + -1;
            pauVar53 = pauVar53 + -1;
            _local_2d60 = *pauVar53;
            auVar138 = ZEXT3264(_local_2d60);
            auVar94 = vcmpps_avx(_local_2d60,local_2a60,1);
          } while ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar94 >> 0x7f,0) == '\0') &&
                     (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar94 >> 0xbf,0) == '\0') &&
                   (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar94[0x1f]);
          uVar57 = vmovmskps_avx(auVar94);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar57);
          if (uVar56 < (uint)POPCOUNT(uVar57)) {
LAB_015b96de:
            do {
              iVar50 = 4;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_015ba32a;
                auVar94 = vcmpps_avx(local_2a60,auVar138._0_32_,6);
                if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar94 >> 0x7f,0) == '\0') &&
                      (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar94 >> 0xbf,0) == '\0') &&
                    (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar94[0x1f]) goto LAB_015b96a1;
                local_2d00 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar94 = vpcmpeqd_avx2(auVar94,auVar94);
                unaff_R12 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                lVar51 = 0;
                local_2c80 = auVar94 ^ local_2ce0;
                goto LAB_015b98cf;
              }
              uVar52 = 8;
              auVar94 = auVar125._0_32_;
              for (lVar51 = 0;
                  (auVar138 = ZEXT3264(auVar94), lVar51 != 4 &&
                  (uVar55 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar51 * 8), uVar55 != 8));
                  lVar51 = lVar51 + 1) {
                uVar57 = *(undefined4 *)(root.ptr + 0x20 + lVar51 * 4);
                auVar60._4_4_ = uVar57;
                auVar60._0_4_ = uVar57;
                auVar60._8_4_ = uVar57;
                auVar60._12_4_ = uVar57;
                auVar60._16_4_ = uVar57;
                auVar60._20_4_ = uVar57;
                auVar60._24_4_ = uVar57;
                auVar60._28_4_ = uVar57;
                auVar44._8_8_ = local_2c00._8_8_;
                auVar44._0_8_ = local_2c00._0_8_;
                auVar44._16_8_ = local_2c00._16_8_;
                auVar44._24_8_ = local_2c00._24_8_;
                auVar45._8_8_ = local_2c00._40_8_;
                auVar45._0_8_ = local_2c00._32_8_;
                auVar45._16_8_ = local_2c00._48_8_;
                auVar45._24_8_ = local_2c00._56_8_;
                auVar46._8_8_ = local_2c00._72_8_;
                auVar46._0_8_ = local_2c00._64_8_;
                auVar46._16_8_ = local_2c00._80_8_;
                auVar46._24_8_ = local_2c00._88_8_;
                auVar74 = vsubps_avx(auVar60,auVar44);
                auVar138._0_4_ = (float)local_2b40._0_4_ * auVar74._0_4_;
                auVar138._4_4_ = (float)local_2b40._4_4_ * auVar74._4_4_;
                auVar138._8_4_ = fStack_2b38 * auVar74._8_4_;
                auVar138._12_4_ = fStack_2b34 * auVar74._12_4_;
                auVar138._16_4_ = fStack_2b30 * auVar74._16_4_;
                auVar138._20_4_ = fStack_2b2c * auVar74._20_4_;
                auVar138._28_36_ = auVar110._28_36_;
                auVar138._24_4_ = fStack_2b28 * auVar74._24_4_;
                auVar101 = auVar138._0_32_;
                auVar110 = ZEXT3264(auVar101);
                uVar57 = *(undefined4 *)(root.ptr + 0x40 + lVar51 * 4);
                auVar61._4_4_ = uVar57;
                auVar61._0_4_ = uVar57;
                auVar61._8_4_ = uVar57;
                auVar61._12_4_ = uVar57;
                auVar61._16_4_ = uVar57;
                auVar61._20_4_ = uVar57;
                auVar61._24_4_ = uVar57;
                auVar61._28_4_ = uVar57;
                auVar74 = vsubps_avx(auVar61,auVar45);
                auVar117._0_4_ = local_2b20._0_4_ * auVar74._0_4_;
                auVar117._4_4_ = local_2b20._4_4_ * auVar74._4_4_;
                auVar117._8_4_ = local_2b20._8_4_ * auVar74._8_4_;
                auVar117._12_4_ = local_2b20._12_4_ * auVar74._12_4_;
                auVar117._16_4_ = local_2b20._16_4_ * auVar74._16_4_;
                auVar117._20_4_ = local_2b20._20_4_ * auVar74._20_4_;
                auVar117._28_36_ = auVar116._28_36_;
                auVar117._24_4_ = local_2b20._24_4_ * auVar74._24_4_;
                auVar104 = auVar117._0_32_;
                auVar116 = ZEXT3264(auVar104);
                uVar57 = *(undefined4 *)(root.ptr + 0x60 + lVar51 * 4);
                auVar62._4_4_ = uVar57;
                auVar62._0_4_ = uVar57;
                auVar62._8_4_ = uVar57;
                auVar62._12_4_ = uVar57;
                auVar62._16_4_ = uVar57;
                auVar62._20_4_ = uVar57;
                auVar62._24_4_ = uVar57;
                auVar62._28_4_ = uVar57;
                auVar74 = vsubps_avx(auVar62,auVar46);
                auVar123._0_4_ = local_2b00._0_4_ * auVar74._0_4_;
                auVar123._4_4_ = local_2b00._4_4_ * auVar74._4_4_;
                auVar123._8_4_ = local_2b00._8_4_ * auVar74._8_4_;
                auVar123._12_4_ = local_2b00._12_4_ * auVar74._12_4_;
                auVar123._16_4_ = local_2b00._16_4_ * auVar74._16_4_;
                auVar123._20_4_ = local_2b00._20_4_ * auVar74._20_4_;
                auVar123._28_36_ = auVar122._28_36_;
                auVar123._24_4_ = local_2b00._24_4_ * auVar74._24_4_;
                auVar105 = auVar123._0_32_;
                auVar122 = ZEXT3264(auVar105);
                uVar57 = *(undefined4 *)(root.ptr + 0x30 + lVar51 * 4);
                auVar63._4_4_ = uVar57;
                auVar63._0_4_ = uVar57;
                auVar63._8_4_ = uVar57;
                auVar63._12_4_ = uVar57;
                auVar63._16_4_ = uVar57;
                auVar63._20_4_ = uVar57;
                auVar63._24_4_ = uVar57;
                auVar63._28_4_ = uVar57;
                auVar74 = vsubps_avx(auVar63,auVar44);
                auVar23._4_4_ = (float)local_2b40._4_4_ * auVar74._4_4_;
                auVar23._0_4_ = (float)local_2b40._0_4_ * auVar74._0_4_;
                auVar23._8_4_ = fStack_2b38 * auVar74._8_4_;
                auVar23._12_4_ = fStack_2b34 * auVar74._12_4_;
                auVar23._16_4_ = fStack_2b30 * auVar74._16_4_;
                auVar23._20_4_ = fStack_2b2c * auVar74._20_4_;
                auVar23._24_4_ = fStack_2b28 * auVar74._24_4_;
                auVar23._28_4_ = (int)((ulong)local_2c00._24_8_ >> 0x20);
                uVar57 = *(undefined4 *)(root.ptr + 0x50 + lVar51 * 4);
                auVar64._4_4_ = uVar57;
                auVar64._0_4_ = uVar57;
                auVar64._8_4_ = uVar57;
                auVar64._12_4_ = uVar57;
                auVar64._16_4_ = uVar57;
                auVar64._20_4_ = uVar57;
                auVar64._24_4_ = uVar57;
                auVar64._28_4_ = uVar57;
                auVar74 = vsubps_avx(auVar64,auVar45);
                auVar24._4_4_ = local_2b20._4_4_ * auVar74._4_4_;
                auVar24._0_4_ = local_2b20._0_4_ * auVar74._0_4_;
                auVar24._8_4_ = local_2b20._8_4_ * auVar74._8_4_;
                auVar24._12_4_ = local_2b20._12_4_ * auVar74._12_4_;
                auVar24._16_4_ = local_2b20._16_4_ * auVar74._16_4_;
                auVar24._20_4_ = local_2b20._20_4_ * auVar74._20_4_;
                auVar24._24_4_ = local_2b20._24_4_ * auVar74._24_4_;
                auVar24._28_4_ = (int)((ulong)local_2c00._56_8_ >> 0x20);
                uVar57 = *(undefined4 *)(root.ptr + 0x70 + lVar51 * 4);
                auVar65._4_4_ = uVar57;
                auVar65._0_4_ = uVar57;
                auVar65._8_4_ = uVar57;
                auVar65._12_4_ = uVar57;
                auVar65._16_4_ = uVar57;
                auVar65._20_4_ = uVar57;
                auVar65._24_4_ = uVar57;
                auVar65._28_4_ = uVar57;
                auVar74 = vsubps_avx(auVar65,auVar46);
                auVar25._4_4_ = local_2b00._4_4_ * auVar74._4_4_;
                auVar25._0_4_ = local_2b00._0_4_ * auVar74._0_4_;
                auVar25._8_4_ = local_2b00._8_4_ * auVar74._8_4_;
                auVar25._12_4_ = local_2b00._12_4_ * auVar74._12_4_;
                auVar25._16_4_ = local_2b00._16_4_ * auVar74._16_4_;
                auVar25._20_4_ = local_2b00._20_4_ * auVar74._20_4_;
                auVar25._24_4_ = local_2b00._24_4_ * auVar74._24_4_;
                auVar25._28_4_ = (int)((ulong)local_2c00._88_8_ >> 0x20);
                auVar74 = vminps_avx(auVar101,auVar23);
                auVar78 = vminps_avx(auVar104,auVar24);
                auVar74 = vmaxps_avx(auVar74,auVar78);
                auVar78 = vminps_avx(auVar105,auVar25);
                auVar74 = vmaxps_avx(auVar74,auVar78);
                auVar26._4_4_ = auVar134._4_4_ * auVar74._4_4_;
                auVar26._0_4_ = auVar134._0_4_ * auVar74._0_4_;
                auVar26._8_4_ = auVar134._8_4_ * auVar74._8_4_;
                auVar26._12_4_ = auVar134._12_4_ * auVar74._12_4_;
                auVar26._16_4_ = auVar134._16_4_ * auVar74._16_4_;
                auVar26._20_4_ = auVar134._20_4_ * auVar74._20_4_;
                auVar26._24_4_ = auVar134._24_4_ * auVar74._24_4_;
                auVar26._28_4_ = auVar74._28_4_;
                auVar74 = vmaxps_avx(auVar101,auVar23);
                auVar78 = vmaxps_avx(auVar104,auVar24);
                auVar78 = vminps_avx(auVar74,auVar78);
                auVar74 = vmaxps_avx(auVar105,auVar25);
                auVar74 = vminps_avx(auVar78,auVar74);
                auVar27._4_4_ = auVar135._4_4_ * auVar74._4_4_;
                auVar27._0_4_ = auVar135._0_4_ * auVar74._0_4_;
                auVar27._8_4_ = auVar135._8_4_ * auVar74._8_4_;
                auVar27._12_4_ = auVar135._12_4_ * auVar74._12_4_;
                auVar27._16_4_ = auVar135._16_4_ * auVar74._16_4_;
                auVar27._20_4_ = auVar135._20_4_ * auVar74._20_4_;
                auVar27._24_4_ = auVar135._24_4_ * auVar74._24_4_;
                auVar27._28_4_ = auVar74._28_4_;
                auVar74 = vmaxps_avx(auVar26,local_2a80);
                auVar78 = vminps_avx(auVar27,local_2a60);
                auVar78 = vcmpps_avx(auVar74,auVar78,2);
                auVar81 = ZEXT3264(auVar78);
                uVar54 = uVar52;
                auVar74 = auVar94;
                if (((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar78 >> 0x7f,0) != '\0') ||
                       (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar78 >> 0xbf,0) != '\0') ||
                     (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar78[0x1f] < '\0') &&
                   (auVar74 = vblendvps_avx(auVar125._0_32_,auVar26,auVar78), uVar54 = uVar55,
                   uVar52 != 8)) {
                  *puVar59 = uVar52;
                  puVar59 = puVar59 + 1;
                  *pauVar53 = auVar94;
                  pauVar53 = pauVar53 + 1;
                }
                auVar94 = auVar74;
                uVar52 = uVar54;
              }
              if (uVar52 == 8) goto LAB_015b985d;
              auVar74 = vcmpps_avx(local_2a60,auVar94,6);
              uVar57 = vmovmskps_avx(auVar74);
              root.ptr = uVar52;
            } while ((byte)uVar56 < (byte)POPCOUNT(uVar57));
            *puVar59 = uVar52;
            puVar59 = puVar59 + 1;
            *pauVar53 = auVar94;
            pauVar53 = pauVar53 + 1;
          }
          else {
            while (unaff_R12 != 0) {
              k = 0;
              for (uVar56 = unaff_R12; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              unaff_R12 = unaff_R12 - 1 & unaff_R12;
              local_2d40._0_8_ = k;
              auVar81 = ZEXT1664(auVar81._0_16_);
              auVar110 = ZEXT1664(auVar110._0_16_);
              auVar116 = ZEXT1664(auVar116._0_16_);
              auVar122 = ZEXT1664(auVar122._0_16_);
              bVar49 = occluded1(local_2d08,local_2d10,root,k,&local_2db1,ray,
                                 (TravRayK<8,_true> *)&local_2c00.field_0,context);
              uVar56 = local_2da8;
              context = local_2db0;
              if (bVar49) {
                *(undefined4 *)(local_2ce0 + local_2d40._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar94 = _DAT_01f7b020 & ~local_2ce0;
            iVar50 = 3;
            auVar125 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar135 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar138 = ZEXT3264(_local_2d60);
            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar94 >> 0x7f,0) != '\0') ||
                  (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar94 >> 0xbf,0) != '\0') ||
                (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar94[0x1f] < '\0') {
              auVar81 = ZEXT3264(local_2a60);
              auVar94._8_4_ = 0xff800000;
              auVar94._0_8_ = 0xff800000ff800000;
              auVar94._12_4_ = 0xff800000;
              auVar94._16_4_ = 0xff800000;
              auVar94._20_4_ = 0xff800000;
              auVar94._24_4_ = 0xff800000;
              auVar94._28_4_ = 0xff800000;
              local_2a60 = vblendvps_avx(local_2a60,auVar94,local_2ce0);
              iVar50 = 2;
            }
            unaff_R12 = 0;
            if ((uint)uVar56 < (uint)POPCOUNT(uVar57)) goto LAB_015b96de;
          }
LAB_015b985d:
        } while ((iVar50 == 4) || (iVar50 == 2));
LAB_015ba32a:
        auVar94 = vandps_avx(local_2a40,local_2ce0);
        auVar80._8_4_ = 0xff800000;
        auVar80._0_8_ = 0xff800000ff800000;
        auVar80._12_4_ = 0xff800000;
        auVar80._16_4_ = 0xff800000;
        auVar80._20_4_ = 0xff800000;
        auVar80._24_4_ = 0xff800000;
        auVar80._28_4_ = 0xff800000;
        auVar94 = vmaskmovps_avx(auVar94,auVar80);
        *(undefined1 (*) [32])local_2d98 = auVar94;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_015b98cf:
  do {
    auVar94 = auVar81._0_32_;
    if (lVar51 == local_2d00) break;
    local_2ce8 = lVar51 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_2cf0 = context->scene;
    lVar58 = 0;
    auVar74 = local_2c80;
    local_2da0 = unaff_R12;
    local_2cf8 = lVar51;
    do {
      if ((lVar58 == 4) || (*(int *)(unaff_R12 + lVar58 * 4) == -1)) break;
      pfVar5 = (local_2cf0->vertices).items[*(uint *)((unaff_R12 - 0x10) + lVar58 * 4)];
      uVar52 = (ulong)*(uint *)((unaff_R12 - 0x40) + lVar58 * 4);
      uVar55 = (ulong)*(uint *)((unaff_R12 - 0x30) + lVar58 * 4);
      fVar2 = pfVar5[uVar52];
      auVar66._4_4_ = fVar2;
      auVar66._0_4_ = fVar2;
      auVar66._8_4_ = fVar2;
      auVar66._12_4_ = fVar2;
      auVar66._16_4_ = fVar2;
      auVar66._20_4_ = fVar2;
      auVar66._24_4_ = fVar2;
      auVar66._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 1];
      auVar75._4_4_ = fVar2;
      auVar75._0_4_ = fVar2;
      auVar75._8_4_ = fVar2;
      auVar75._12_4_ = fVar2;
      auVar75._16_4_ = fVar2;
      auVar75._20_4_ = fVar2;
      auVar75._24_4_ = fVar2;
      auVar75._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 2];
      auVar91._4_4_ = fVar2;
      auVar91._0_4_ = fVar2;
      auVar91._8_4_ = fVar2;
      auVar91._12_4_ = fVar2;
      auVar91._16_4_ = fVar2;
      auVar91._20_4_ = fVar2;
      auVar91._24_4_ = fVar2;
      auVar91._28_4_ = fVar2;
      fVar2 = pfVar5[uVar55];
      auVar96._4_4_ = fVar2;
      auVar96._0_4_ = fVar2;
      auVar96._8_4_ = fVar2;
      auVar96._12_4_ = fVar2;
      auVar96._16_4_ = fVar2;
      auVar96._20_4_ = fVar2;
      auVar96._24_4_ = fVar2;
      auVar96._28_4_ = fVar2;
      fVar2 = pfVar5[uVar55 + 1];
      auVar102._4_4_ = fVar2;
      auVar102._0_4_ = fVar2;
      auVar102._8_4_ = fVar2;
      auVar102._12_4_ = fVar2;
      auVar102._16_4_ = fVar2;
      auVar102._20_4_ = fVar2;
      auVar102._24_4_ = fVar2;
      auVar102._28_4_ = fVar2;
      fVar2 = pfVar5[uVar55 + 2];
      auVar107._4_4_ = fVar2;
      auVar107._0_4_ = fVar2;
      auVar107._8_4_ = fVar2;
      auVar107._12_4_ = fVar2;
      auVar107._16_4_ = fVar2;
      auVar107._20_4_ = fVar2;
      auVar107._24_4_ = fVar2;
      auVar107._28_4_ = fVar2;
      uVar52 = (ulong)*(uint *)((unaff_R12 - 0x20) + lVar58 * 4);
      fVar2 = pfVar5[uVar52];
      auVar111._4_4_ = fVar2;
      auVar111._0_4_ = fVar2;
      auVar111._8_4_ = fVar2;
      auVar111._12_4_ = fVar2;
      auVar111._16_4_ = fVar2;
      auVar111._20_4_ = fVar2;
      auVar111._24_4_ = fVar2;
      auVar111._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 1];
      auVar137._4_4_ = fVar2;
      auVar137._0_4_ = fVar2;
      auVar137._8_4_ = fVar2;
      auVar137._12_4_ = fVar2;
      auVar137._16_4_ = fVar2;
      auVar137._20_4_ = fVar2;
      auVar137._24_4_ = fVar2;
      auVar137._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 2];
      auVar118._4_4_ = fVar2;
      auVar118._0_4_ = fVar2;
      auVar118._8_4_ = fVar2;
      auVar118._12_4_ = fVar2;
      auVar118._16_4_ = fVar2;
      auVar118._20_4_ = fVar2;
      auVar118._24_4_ = fVar2;
      auVar118._28_4_ = fVar2;
      local_2c10 = *(undefined8 *)(local_2ce8 + 0x30);
      uStack_2c08 = *(undefined8 *)(local_2ce8 + 0x38);
      local_2c20 = *(undefined8 *)(local_2ce8 + 0x40);
      uStack_2c18 = *(undefined8 *)(local_2ce8 + 0x48);
      auVar94 = *(undefined1 (*) [32])ray;
      auVar78 = *(undefined1 (*) [32])(ray + 0x20);
      auVar101 = *(undefined1 (*) [32])(ray + 0x40);
      local_2820 = vsubps_avx(auVar66,auVar94);
      local_2840 = vsubps_avx(auVar75,auVar78);
      local_2860 = vsubps_avx(auVar91,auVar101);
      auVar104 = vsubps_avx(auVar96,auVar94);
      auVar105 = vsubps_avx(auVar102,auVar78);
      auVar106 = vsubps_avx(auVar107,auVar101);
      auVar77 = vsubps_avx(auVar111,auVar94);
      auVar124 = vsubps_avx(auVar137,auVar78);
      auVar101 = vsubps_avx(auVar118,auVar101);
      local_2880 = vsubps_avx(auVar77,local_2820);
      local_2c60 = vsubps_avx(auVar124,local_2840);
      local_28a0 = vsubps_avx(auVar101,local_2860);
      auVar97._0_4_ = auVar77._0_4_ + local_2820._0_4_;
      auVar97._4_4_ = auVar77._4_4_ + local_2820._4_4_;
      auVar97._8_4_ = auVar77._8_4_ + local_2820._8_4_;
      auVar97._12_4_ = auVar77._12_4_ + local_2820._12_4_;
      auVar97._16_4_ = auVar77._16_4_ + local_2820._16_4_;
      auVar97._20_4_ = auVar77._20_4_ + local_2820._20_4_;
      auVar97._24_4_ = auVar77._24_4_ + local_2820._24_4_;
      auVar97._28_4_ = auVar77._28_4_ + local_2820._28_4_;
      auVar112._0_4_ = local_2840._0_4_ + auVar124._0_4_;
      auVar112._4_4_ = local_2840._4_4_ + auVar124._4_4_;
      auVar112._8_4_ = local_2840._8_4_ + auVar124._8_4_;
      auVar112._12_4_ = local_2840._12_4_ + auVar124._12_4_;
      auVar112._16_4_ = local_2840._16_4_ + auVar124._16_4_;
      auVar112._20_4_ = local_2840._20_4_ + auVar124._20_4_;
      auVar112._24_4_ = local_2840._24_4_ + auVar124._24_4_;
      auVar112._28_4_ = local_2840._28_4_ + auVar124._28_4_;
      fVar2 = local_2860._0_4_;
      auVar119._0_4_ = auVar101._0_4_ + fVar2;
      fVar7 = local_2860._4_4_;
      auVar119._4_4_ = auVar101._4_4_ + fVar7;
      fVar8 = local_2860._8_4_;
      auVar119._8_4_ = auVar101._8_4_ + fVar8;
      fVar9 = local_2860._12_4_;
      auVar119._12_4_ = auVar101._12_4_ + fVar9;
      fVar10 = local_2860._16_4_;
      auVar119._16_4_ = auVar101._16_4_ + fVar10;
      fVar11 = local_2860._20_4_;
      auVar119._20_4_ = auVar101._20_4_ + fVar11;
      fVar12 = local_2860._24_4_;
      auVar119._24_4_ = auVar101._24_4_ + fVar12;
      fVar95 = auVar101._28_4_;
      auVar119._28_4_ = fVar95 + local_2860._28_4_;
      auVar18._4_4_ = local_28a0._4_4_ * auVar112._4_4_;
      auVar18._0_4_ = local_28a0._0_4_ * auVar112._0_4_;
      auVar18._8_4_ = local_28a0._8_4_ * auVar112._8_4_;
      auVar18._12_4_ = local_28a0._12_4_ * auVar112._12_4_;
      auVar18._16_4_ = local_28a0._16_4_ * auVar112._16_4_;
      auVar18._20_4_ = local_28a0._20_4_ * auVar112._20_4_;
      auVar18._24_4_ = local_28a0._24_4_ * auVar112._24_4_;
      auVar18._28_4_ = auVar78._28_4_;
      auVar17 = vfmsub231ps_fma(auVar18,local_2c60,auVar119);
      auVar19._4_4_ = auVar119._4_4_ * local_2880._4_4_;
      auVar19._0_4_ = auVar119._0_4_ * local_2880._0_4_;
      auVar19._8_4_ = auVar119._8_4_ * local_2880._8_4_;
      auVar19._12_4_ = auVar119._12_4_ * local_2880._12_4_;
      auVar19._16_4_ = auVar119._16_4_ * local_2880._16_4_;
      auVar19._20_4_ = auVar119._20_4_ * local_2880._20_4_;
      auVar19._24_4_ = auVar119._24_4_ * local_2880._24_4_;
      auVar19._28_4_ = auVar94._28_4_;
      auVar73 = vfmsub231ps_fma(auVar19,local_28a0,auVar97);
      auVar99._4_4_ = local_2c60._4_4_ * auVar97._4_4_;
      auVar99._0_4_ = local_2c60._0_4_ * auVar97._0_4_;
      auVar99._8_4_ = local_2c60._8_4_ * auVar97._8_4_;
      auVar99._12_4_ = local_2c60._12_4_ * auVar97._12_4_;
      auVar99._16_4_ = local_2c60._16_4_ * auVar97._16_4_;
      auVar99._20_4_ = local_2c60._20_4_ * auVar97._20_4_;
      auVar99._24_4_ = local_2c60._24_4_ * auVar97._24_4_;
      auVar99._28_4_ = auVar97._28_4_;
      auVar20 = vfmsub231ps_fma(auVar99,local_2880,auVar112);
      pRVar1 = ray + 0xc0;
      fVar71 = *(float *)pRVar1;
      fVar82 = *(float *)(ray + 0xc4);
      fVar84 = *(float *)(ray + 200);
      fVar86 = *(float *)(ray + 0xcc);
      fVar88 = *(float *)(ray + 0xd0);
      fVar89 = *(float *)(ray + 0xd4);
      fVar90 = *(float *)(ray + 0xd8);
      auVar48 = *(undefined1 (*) [28])pRVar1;
      auVar98._0_4_ = fVar71 * auVar20._0_4_;
      auVar98._4_4_ = fVar82 * auVar20._4_4_;
      auVar98._8_4_ = fVar84 * auVar20._8_4_;
      auVar98._12_4_ = fVar86 * auVar20._12_4_;
      auVar98._16_4_ = fVar88 * 0.0;
      auVar98._20_4_ = fVar89 * 0.0;
      auVar98._24_4_ = fVar90 * 0.0;
      auVar98._28_4_ = 0;
      local_2cc0 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar73 = vfmadd231ps_fma(auVar98,local_2cc0,ZEXT1632(auVar73));
      local_2ca0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_2ca0,ZEXT1632(auVar17));
      local_28c0 = vsubps_avx(local_2840,auVar105);
      auVar133 = vsubps_avx(local_2860,auVar106);
      auVar113._0_4_ = local_2840._0_4_ + auVar105._0_4_;
      auVar113._4_4_ = local_2840._4_4_ + auVar105._4_4_;
      auVar113._8_4_ = local_2840._8_4_ + auVar105._8_4_;
      auVar113._12_4_ = local_2840._12_4_ + auVar105._12_4_;
      auVar113._16_4_ = local_2840._16_4_ + auVar105._16_4_;
      auVar113._20_4_ = local_2840._20_4_ + auVar105._20_4_;
      auVar113._24_4_ = local_2840._24_4_ + auVar105._24_4_;
      auVar113._28_4_ = local_2840._28_4_ + auVar105._28_4_;
      auVar145._0_4_ = fVar2 + auVar106._0_4_;
      auVar145._4_4_ = fVar7 + auVar106._4_4_;
      auVar145._8_4_ = fVar8 + auVar106._8_4_;
      auVar145._12_4_ = fVar9 + auVar106._12_4_;
      auVar145._16_4_ = fVar10 + auVar106._16_4_;
      auVar145._20_4_ = fVar11 + auVar106._20_4_;
      auVar145._24_4_ = fVar12 + auVar106._24_4_;
      auVar145._28_4_ = local_2860._28_4_ + auVar106._28_4_;
      fVar136 = auVar133._0_4_;
      fVar139 = auVar133._4_4_;
      auVar108._4_4_ = fVar139 * auVar113._4_4_;
      auVar108._0_4_ = fVar136 * auVar113._0_4_;
      fVar140 = auVar133._8_4_;
      auVar108._8_4_ = fVar140 * auVar113._8_4_;
      fVar141 = auVar133._12_4_;
      auVar108._12_4_ = fVar141 * auVar113._12_4_;
      fVar142 = auVar133._16_4_;
      auVar108._16_4_ = fVar142 * auVar113._16_4_;
      fVar143 = auVar133._20_4_;
      auVar108._20_4_ = fVar143 * auVar113._20_4_;
      fVar144 = auVar133._24_4_;
      auVar108._24_4_ = fVar144 * auVar113._24_4_;
      auVar108._28_4_ = local_2880._28_4_;
      auVar20 = vfmsub231ps_fma(auVar108,local_28c0,auVar145);
      auVar18 = vsubps_avx(local_2820,auVar104);
      fVar72 = auVar18._0_4_;
      fVar83 = auVar18._4_4_;
      auVar28._4_4_ = auVar145._4_4_ * fVar83;
      auVar28._0_4_ = auVar145._0_4_ * fVar72;
      fVar85 = auVar18._8_4_;
      auVar28._8_4_ = auVar145._8_4_ * fVar85;
      fVar87 = auVar18._12_4_;
      auVar28._12_4_ = auVar145._12_4_ * fVar87;
      fVar14 = auVar18._16_4_;
      auVar28._16_4_ = auVar145._16_4_ * fVar14;
      fVar15 = auVar18._20_4_;
      auVar28._20_4_ = auVar145._20_4_ * fVar15;
      fVar16 = auVar18._24_4_;
      auVar28._24_4_ = auVar145._24_4_ * fVar16;
      auVar28._28_4_ = auVar145._28_4_;
      auVar114._0_4_ = auVar104._0_4_ + local_2820._0_4_;
      auVar114._4_4_ = auVar104._4_4_ + local_2820._4_4_;
      auVar114._8_4_ = auVar104._8_4_ + local_2820._8_4_;
      auVar114._12_4_ = auVar104._12_4_ + local_2820._12_4_;
      auVar114._16_4_ = auVar104._16_4_ + local_2820._16_4_;
      auVar114._20_4_ = auVar104._20_4_ + local_2820._20_4_;
      auVar114._24_4_ = auVar104._24_4_ + local_2820._24_4_;
      auVar114._28_4_ = auVar104._28_4_ + local_2820._28_4_;
      auVar17 = vfmsub231ps_fma(auVar28,auVar133,auVar114);
      fVar126 = local_28c0._0_4_;
      fVar127 = local_28c0._4_4_;
      auVar29._4_4_ = fVar127 * auVar114._4_4_;
      auVar29._0_4_ = fVar126 * auVar114._0_4_;
      fVar128 = local_28c0._8_4_;
      auVar29._8_4_ = fVar128 * auVar114._8_4_;
      fVar129 = local_28c0._12_4_;
      auVar29._12_4_ = fVar129 * auVar114._12_4_;
      fVar130 = local_28c0._16_4_;
      auVar29._16_4_ = fVar130 * auVar114._16_4_;
      fVar131 = local_28c0._20_4_;
      auVar29._20_4_ = fVar131 * auVar114._20_4_;
      fVar132 = local_28c0._24_4_;
      auVar29._24_4_ = fVar132 * auVar114._24_4_;
      auVar29._28_4_ = auVar114._28_4_;
      auVar21 = vfmsub231ps_fma(auVar29,auVar18,auVar113);
      auVar30._4_4_ = fVar82 * auVar21._4_4_;
      auVar30._0_4_ = fVar71 * auVar21._0_4_;
      auVar30._8_4_ = fVar84 * auVar21._8_4_;
      auVar30._12_4_ = fVar86 * auVar21._12_4_;
      auVar30._16_4_ = fVar88 * 0.0;
      auVar30._20_4_ = fVar89 * 0.0;
      auVar30._24_4_ = fVar90 * 0.0;
      auVar30._28_4_ = auVar113._28_4_;
      auVar17 = vfmadd231ps_fma(auVar30,local_2cc0,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_2ca0,ZEXT1632(auVar20));
      auVar19 = vsubps_avx(auVar104,auVar77);
      auVar76._0_4_ = auVar104._0_4_ + auVar77._0_4_;
      auVar76._4_4_ = auVar104._4_4_ + auVar77._4_4_;
      auVar76._8_4_ = auVar104._8_4_ + auVar77._8_4_;
      auVar76._12_4_ = auVar104._12_4_ + auVar77._12_4_;
      auVar76._16_4_ = auVar104._16_4_ + auVar77._16_4_;
      auVar76._20_4_ = auVar104._20_4_ + auVar77._20_4_;
      auVar76._24_4_ = auVar104._24_4_ + auVar77._24_4_;
      auVar76._28_4_ = auVar104._28_4_ + auVar77._28_4_;
      auVar77 = vsubps_avx(auVar105,auVar124);
      auVar67._0_4_ = auVar105._0_4_ + auVar124._0_4_;
      auVar67._4_4_ = auVar105._4_4_ + auVar124._4_4_;
      auVar67._8_4_ = auVar105._8_4_ + auVar124._8_4_;
      auVar67._12_4_ = auVar105._12_4_ + auVar124._12_4_;
      auVar67._16_4_ = auVar105._16_4_ + auVar124._16_4_;
      auVar67._20_4_ = auVar105._20_4_ + auVar124._20_4_;
      auVar67._24_4_ = auVar105._24_4_ + auVar124._24_4_;
      auVar67._28_4_ = auVar105._28_4_ + auVar124._28_4_;
      auVar121 = vsubps_avx(auVar106,auVar101);
      auVar92._0_4_ = auVar106._0_4_ + auVar101._0_4_;
      auVar92._4_4_ = auVar106._4_4_ + auVar101._4_4_;
      auVar92._8_4_ = auVar106._8_4_ + auVar101._8_4_;
      auVar92._12_4_ = auVar106._12_4_ + auVar101._12_4_;
      auVar92._16_4_ = auVar106._16_4_ + auVar101._16_4_;
      auVar92._20_4_ = auVar106._20_4_ + auVar101._20_4_;
      auVar92._24_4_ = auVar106._24_4_ + auVar101._24_4_;
      auVar92._28_4_ = auVar106._28_4_ + fVar95;
      auVar31._4_4_ = auVar121._4_4_ * auVar67._4_4_;
      auVar31._0_4_ = auVar121._0_4_ * auVar67._0_4_;
      auVar31._8_4_ = auVar121._8_4_ * auVar67._8_4_;
      auVar31._12_4_ = auVar121._12_4_ * auVar67._12_4_;
      auVar31._16_4_ = auVar121._16_4_ * auVar67._16_4_;
      auVar31._20_4_ = auVar121._20_4_ * auVar67._20_4_;
      auVar31._24_4_ = auVar121._24_4_ * auVar67._24_4_;
      auVar31._28_4_ = fVar95;
      auVar21 = vfmsub231ps_fma(auVar31,auVar77,auVar92);
      auVar32._4_4_ = auVar19._4_4_ * auVar92._4_4_;
      auVar32._0_4_ = auVar19._0_4_ * auVar92._0_4_;
      auVar32._8_4_ = auVar19._8_4_ * auVar92._8_4_;
      auVar32._12_4_ = auVar19._12_4_ * auVar92._12_4_;
      auVar32._16_4_ = auVar19._16_4_ * auVar92._16_4_;
      auVar32._20_4_ = auVar19._20_4_ * auVar92._20_4_;
      auVar32._24_4_ = auVar19._24_4_ * auVar92._24_4_;
      auVar32._28_4_ = auVar92._28_4_;
      auVar20 = vfmsub231ps_fma(auVar32,auVar121,auVar76);
      auVar33._4_4_ = auVar77._4_4_ * auVar76._4_4_;
      auVar33._0_4_ = auVar77._0_4_ * auVar76._0_4_;
      auVar33._8_4_ = auVar77._8_4_ * auVar76._8_4_;
      auVar33._12_4_ = auVar77._12_4_ * auVar76._12_4_;
      auVar33._16_4_ = auVar77._16_4_ * auVar76._16_4_;
      auVar33._20_4_ = auVar77._20_4_ * auVar76._20_4_;
      auVar33._24_4_ = auVar77._24_4_ * auVar76._24_4_;
      auVar33._28_4_ = auVar76._28_4_;
      auVar22 = vfmsub231ps_fma(auVar33,auVar19,auVar67);
      auVar34._4_4_ = fVar82 * auVar22._4_4_;
      auVar34._0_4_ = fVar71 * auVar22._0_4_;
      auVar34._8_4_ = fVar84 * auVar22._8_4_;
      auVar34._12_4_ = fVar86 * auVar22._12_4_;
      auVar34._16_4_ = fVar88 * 0.0;
      auVar34._20_4_ = fVar89 * 0.0;
      auVar34._24_4_ = fVar90 * 0.0;
      auVar34._28_4_ = auVar67._28_4_;
      auVar20 = vfmadd231ps_fma(auVar34,local_2cc0,ZEXT1632(auVar20));
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_2ca0,ZEXT1632(auVar21));
      auVar108 = ZEXT1632(CONCAT412(auVar20._12_4_ + auVar73._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar20._8_4_ + auVar73._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar20._4_4_ + auVar73._4_4_ + auVar17._4_4_,
                                                      auVar20._0_4_ + auVar73._0_4_ + auVar17._0_4_)
                                            )));
      auVar94 = vandps_avx(local_2940,auVar108);
      fVar71 = auVar94._0_4_ * 1.1920929e-07;
      fVar82 = auVar94._4_4_ * 1.1920929e-07;
      auVar35._4_4_ = fVar82;
      auVar35._0_4_ = fVar71;
      fVar84 = auVar94._8_4_ * 1.1920929e-07;
      auVar35._8_4_ = fVar84;
      fVar86 = auVar94._12_4_ * 1.1920929e-07;
      auVar35._12_4_ = fVar86;
      fVar88 = auVar94._16_4_ * 1.1920929e-07;
      auVar35._16_4_ = fVar88;
      fVar89 = auVar94._20_4_ * 1.1920929e-07;
      auVar35._20_4_ = fVar89;
      fVar90 = auVar94._24_4_ * 1.1920929e-07;
      auVar35._24_4_ = fVar90;
      auVar35._28_4_ = auVar94._28_4_;
      auVar99 = ZEXT1632(auVar73);
      auVar78 = vminps_avx(auVar99,ZEXT1632(auVar17));
      auVar78 = vminps_avx(auVar78,ZEXT1632(auVar20));
      auVar115._8_4_ = 0x80000000;
      auVar115._0_8_ = 0x8000000080000000;
      auVar115._12_4_ = 0x80000000;
      auVar115._16_4_ = 0x80000000;
      auVar115._20_4_ = 0x80000000;
      auVar115._24_4_ = 0x80000000;
      auVar115._28_4_ = 0x80000000;
      auVar103._0_8_ = CONCAT44(fVar82,fVar71) ^ 0x8000000080000000;
      auVar103._8_4_ = -fVar84;
      auVar103._12_4_ = -fVar86;
      auVar103._16_4_ = -fVar88;
      auVar103._20_4_ = -fVar89;
      auVar103._24_4_ = -fVar90;
      auVar103._28_4_ = auVar94._28_4_ ^ 0x80000000;
      auVar94 = vcmpps_avx(auVar78,auVar103,5);
      auVar101 = vmaxps_avx(auVar99,ZEXT1632(auVar17));
      auVar78 = vmaxps_avx(auVar101,ZEXT1632(auVar20));
      auVar78 = vcmpps_avx(auVar78,auVar35,2);
      auVar104 = vorps_avx(auVar94,auVar78);
      auVar105 = auVar74 & auVar104;
      auVar94 = vandps_avx(auVar104,auVar74);
      auVar78 = auVar94;
      auVar106 = auVar108;
      auVar124 = auVar115;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0x7f,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0xbf,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar105[0x1f] < '\0') {
        local_2920 = auVar108;
        local_28e0 = auVar94;
        auVar36._4_4_ = fVar127 * local_28a0._4_4_;
        auVar36._0_4_ = fVar126 * local_28a0._0_4_;
        auVar36._8_4_ = fVar128 * local_28a0._8_4_;
        auVar36._12_4_ = fVar129 * local_28a0._12_4_;
        auVar36._16_4_ = fVar130 * local_28a0._16_4_;
        auVar36._20_4_ = fVar131 * local_28a0._20_4_;
        auVar36._24_4_ = fVar132 * local_28a0._24_4_;
        auVar36._28_4_ = auVar104._28_4_;
        local_2900 = fVar72 * local_2c60._0_4_;
        fStack_28fc = fVar83 * local_2c60._4_4_;
        fStack_28f8 = fVar85 * local_2c60._8_4_;
        fStack_28f4 = fVar87 * local_2c60._12_4_;
        fStack_28f0 = fVar14 * local_2c60._16_4_;
        fStack_28ec = fVar15 * local_2c60._20_4_;
        uStack_28e4 = auVar74._28_4_;
        fStack_28e8 = fVar16 * local_2c60._24_4_;
        auVar73 = vfmsub213ps_fma(local_2c60,auVar133,auVar36);
        auVar37._4_4_ = auVar77._4_4_ * fVar139;
        auVar37._0_4_ = auVar77._0_4_ * fVar136;
        auVar37._8_4_ = auVar77._8_4_ * fVar140;
        auVar37._12_4_ = auVar77._12_4_ * fVar141;
        auVar37._16_4_ = auVar77._16_4_ * fVar142;
        auVar37._20_4_ = auVar77._20_4_ * fVar143;
        auVar37._24_4_ = auVar77._24_4_ * fVar144;
        auVar37._28_4_ = uStack_28e4;
        auVar38._4_4_ = fVar83 * auVar121._4_4_;
        auVar38._0_4_ = fVar72 * auVar121._0_4_;
        auVar38._8_4_ = fVar85 * auVar121._8_4_;
        auVar38._12_4_ = fVar87 * auVar121._12_4_;
        auVar38._16_4_ = fVar14 * auVar121._16_4_;
        auVar38._20_4_ = fVar15 * auVar121._20_4_;
        auVar38._24_4_ = fVar16 * auVar121._24_4_;
        auVar38._28_4_ = auVar101._28_4_;
        auVar20 = vfmsub213ps_fma(auVar121,local_28c0,auVar37);
        auVar78 = vandps_avx(local_2940,auVar36);
        auVar101 = vandps_avx(local_2940,auVar37);
        auVar78 = vcmpps_avx(auVar78,auVar101,1);
        auVar104 = vblendvps_avx(ZEXT1632(auVar20),ZEXT1632(auVar73),auVar78);
        auVar109._0_4_ = auVar19._0_4_ * fVar126;
        auVar109._4_4_ = auVar19._4_4_ * fVar127;
        auVar109._8_4_ = auVar19._8_4_ * fVar128;
        auVar109._12_4_ = auVar19._12_4_ * fVar129;
        auVar109._16_4_ = auVar19._16_4_ * fVar130;
        auVar109._20_4_ = auVar19._20_4_ * fVar131;
        auVar109._24_4_ = auVar19._24_4_ * fVar132;
        auVar109._28_4_ = 0;
        auVar73 = vfmsub213ps_fma(auVar19,auVar133,auVar38);
        auVar39._4_4_ = fVar139 * local_2880._4_4_;
        auVar39._0_4_ = fVar136 * local_2880._0_4_;
        auVar39._8_4_ = fVar140 * local_2880._8_4_;
        auVar39._12_4_ = fVar141 * local_2880._12_4_;
        auVar39._16_4_ = fVar142 * local_2880._16_4_;
        auVar39._20_4_ = fVar143 * local_2880._20_4_;
        auVar39._24_4_ = fVar144 * local_2880._24_4_;
        auVar39._28_4_ = auVar101._28_4_;
        auVar20 = vfmsub213ps_fma(local_28a0,auVar18,auVar39);
        auVar78 = vandps_avx(local_2940,auVar39);
        auVar101 = vandps_avx(local_2940,auVar38);
        auVar78 = vcmpps_avx(auVar78,auVar101,1);
        auVar105 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar20),auVar78);
        auVar47._4_4_ = fStack_28fc;
        auVar47._0_4_ = local_2900;
        auVar47._8_4_ = fStack_28f8;
        auVar47._12_4_ = fStack_28f4;
        auVar47._16_4_ = fStack_28f0;
        auVar47._20_4_ = fStack_28ec;
        auVar47._24_4_ = fStack_28e8;
        auVar47._28_4_ = uStack_28e4;
        auVar73 = vfmsub213ps_fma(local_2880,local_28c0,auVar47);
        auVar20 = vfmsub213ps_fma(auVar77,auVar18,auVar109);
        auVar78 = vandps_avx(local_2940,auVar47);
        auVar101 = vandps_avx(local_2940,auVar109);
        auVar78 = vcmpps_avx(auVar78,auVar101,1);
        afVar13 = (__m256)vblendvps_avx(ZEXT1632(auVar20),ZEXT1632(auVar73),auVar78);
        local_2d60._0_4_ = auVar48._0_4_;
        local_2d60._4_4_ = auVar48._4_4_;
        auStack_2d58._0_4_ = auVar48._8_4_;
        auStack_2d58._4_4_ = auVar48._12_4_;
        fStack_2d50 = auVar48._16_4_;
        fStack_2d4c = auVar48._20_4_;
        fStack_2d48 = auVar48._24_4_;
        auVar40._4_4_ = afVar13[1] * (float)local_2d60._4_4_;
        auVar40._0_4_ = afVar13[0] * (float)local_2d60._0_4_;
        auVar40._8_4_ = afVar13[2] * (float)auStack_2d58._0_4_;
        auVar40._12_4_ = afVar13[3] * (float)auStack_2d58._4_4_;
        auVar40._16_4_ = afVar13[4] * fStack_2d50;
        auVar40._20_4_ = afVar13[5] * fStack_2d4c;
        auVar40._24_4_ = afVar13[6] * fStack_2d48;
        auVar40._28_4_ = auVar78._28_4_;
        auVar73 = vfmadd213ps_fma(local_2cc0,auVar105,auVar40);
        auVar73 = vfmadd213ps_fma(local_2ca0,auVar104,ZEXT1632(auVar73));
        fVar72 = auVar73._0_4_ + auVar73._0_4_;
        fVar83 = auVar73._4_4_ + auVar73._4_4_;
        fVar85 = auVar73._8_4_ + auVar73._8_4_;
        fVar87 = auVar73._12_4_ + auVar73._12_4_;
        auVar77 = ZEXT1632(CONCAT412(fVar87,CONCAT48(fVar85,CONCAT44(fVar83,fVar72))));
        auVar41._4_4_ = afVar13[1] * fVar7;
        auVar41._0_4_ = afVar13[0] * fVar2;
        auVar41._8_4_ = afVar13[2] * fVar8;
        auVar41._12_4_ = afVar13[3] * fVar9;
        auVar41._16_4_ = afVar13[4] * fVar10;
        auVar41._20_4_ = afVar13[5] * fVar11;
        auVar41._24_4_ = afVar13[6] * fVar12;
        auVar41._28_4_ = 0;
        auVar73 = vfmadd213ps_fma(local_2840,auVar105,auVar41);
        auVar20 = vfmadd213ps_fma(local_2820,auVar104,ZEXT1632(auVar73));
        auVar78 = vrcpps_avx(auVar77);
        auVar121._8_4_ = 0x3f800000;
        auVar121._0_8_ = 0x3f8000003f800000;
        auVar121._12_4_ = 0x3f800000;
        auVar121._16_4_ = 0x3f800000;
        auVar121._20_4_ = 0x3f800000;
        auVar121._24_4_ = 0x3f800000;
        auVar121._28_4_ = 0x3f800000;
        auVar73 = vfnmadd213ps_fma(auVar78,auVar77,auVar121);
        auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar78,auVar78);
        auVar106 = ZEXT1632(CONCAT412(auVar73._12_4_ * (auVar20._12_4_ + auVar20._12_4_),
                                      CONCAT48(auVar73._8_4_ * (auVar20._8_4_ + auVar20._8_4_),
                                               CONCAT44(auVar73._4_4_ *
                                                        (auVar20._4_4_ + auVar20._4_4_),
                                                        auVar73._0_4_ *
                                                        (auVar20._0_4_ + auVar20._0_4_)))));
        auVar78 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar106,2);
        auVar101 = vcmpps_avx(auVar106,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar78 = vandps_avx(auVar101,auVar78);
        auVar120._0_8_ = CONCAT44(fVar83,fVar72) ^ 0x8000000080000000;
        auVar120._8_4_ = -fVar85;
        auVar120._12_4_ = -fVar87;
        auVar120._16_4_ = 0x80000000;
        auVar120._20_4_ = 0x80000000;
        auVar120._24_4_ = 0x80000000;
        auVar120._28_4_ = 0x80000000;
        auVar101 = vcmpps_avx(auVar120,auVar77,4);
        auVar78 = vandps_avx(auVar101,auVar78);
        auVar78 = vpslld_avx2(auVar78,0x1f);
        auVar78 = vpsrad_avx2(auVar78,0x1f);
        auVar101 = auVar94 & auVar78;
        auVar78 = vandps_avx(auVar78,auVar94);
        auVar124 = auVar94;
        local_2c60 = auVar115;
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          _local_2960 = auVar99;
          _local_2980 = ZEXT1632(auVar17);
          local_29a0 = auVar108;
          local_29c0 = auVar106;
          local_29e0 = auVar104;
          local_2a00 = auVar105;
          local_2a20.i[0] = (int)afVar13[0];
          local_2a20.i[1] = (int)afVar13[1];
          local_2a20.i[2] = (int)afVar13[2];
          local_2a20.i[3] = (int)afVar13[3];
          local_2a20.i[4] = (int)afVar13[4];
          local_2a20.i[5] = (int)afVar13[5];
          local_2a20.i[6] = (int)afVar13[6];
          local_2a20.i[7] = (int)afVar13[7];
        }
      }
      auVar135 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar125 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar122 = ZEXT3264(auVar121);
      auVar116 = ZEXT3264(auVar124);
      auVar110 = ZEXT3264(auVar106);
      uVar4 = *(uint *)((long)&local_2c10 + lVar58 * 4);
      local_2d60 = (undefined1  [8])(context->scene->geometries).items[uVar4].ptr;
      uVar3 = ((Geometry *)local_2d60)->mask;
      auVar68._4_4_ = uVar3;
      auVar68._0_4_ = uVar3;
      auVar68._8_4_ = uVar3;
      auVar68._12_4_ = uVar3;
      auVar68._16_4_ = uVar3;
      auVar68._20_4_ = uVar3;
      auVar68._24_4_ = uVar3;
      auVar68._28_4_ = uVar3;
      auVar94 = vpand_avx2(auVar68,*(undefined1 (*) [32])(ray + 0x120));
      auVar101 = vpcmpeqd_avx2(auVar94,_DAT_01f7b000);
      auVar94 = auVar78 & ~auVar101;
      unaff_R12 = local_2da0;
      local_2d40 = auVar74;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') {
        auVar94 = vandnps_avx(auVar101,auVar78);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (((Geometry *)local_2d60)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar78 = vrcpps_avx(local_29a0);
          auVar74 = vandps_avx(local_2940,local_29a0);
          auVar100._8_4_ = 0x3f800000;
          auVar100._0_8_ = 0x3f8000003f800000;
          auVar100._12_4_ = 0x3f800000;
          auVar100._16_4_ = 0x3f800000;
          auVar100._20_4_ = 0x3f800000;
          auVar100._24_4_ = 0x3f800000;
          auVar100._28_4_ = 0x3f800000;
          auVar73 = vfnmadd213ps_fma(auVar78,local_29a0,auVar100);
          auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar78,auVar78);
          auVar69._8_4_ = 0x219392ef;
          auVar69._0_8_ = 0x219392ef219392ef;
          auVar69._12_4_ = 0x219392ef;
          auVar69._16_4_ = 0x219392ef;
          auVar69._20_4_ = 0x219392ef;
          auVar69._24_4_ = 0x219392ef;
          auVar69._28_4_ = 0x219392ef;
          auVar78 = vcmpps_avx(auVar74,auVar69,5);
          auVar78 = vandps_avx(auVar78,ZEXT1632(auVar73));
          auVar42._4_4_ = auVar78._4_4_ * (float)local_2960._4_4_;
          auVar42._0_4_ = auVar78._0_4_ * (float)local_2960._0_4_;
          auVar42._8_4_ = auVar78._8_4_ * fStack_2958;
          auVar42._12_4_ = auVar78._12_4_ * fStack_2954;
          auVar42._16_4_ = auVar78._16_4_ * fStack_2950;
          auVar42._20_4_ = auVar78._20_4_ * fStack_294c;
          auVar42._24_4_ = auVar78._24_4_ * fStack_2948;
          auVar42._28_4_ = auVar74._28_4_;
          local_2760 = vminps_avx(auVar42,auVar100);
          auVar43._4_4_ = auVar78._4_4_ * (float)local_2980._4_4_;
          auVar43._0_4_ = auVar78._0_4_ * (float)local_2980._0_4_;
          auVar43._8_4_ = auVar78._8_4_ * fStack_2978;
          auVar43._12_4_ = auVar78._12_4_ * fStack_2974;
          auVar43._16_4_ = auVar78._16_4_ * fStack_2970;
          auVar43._20_4_ = auVar78._20_4_ * fStack_296c;
          auVar43._24_4_ = auVar78._24_4_ * fStack_2968;
          auVar43._28_4_ = auVar78._28_4_;
          local_2780 = vminps_avx(auVar43,auVar100);
          local_2800._0_8_ = local_29e0._0_8_;
          local_2800._8_8_ = local_29e0._8_8_;
          local_2800._16_8_ = local_29e0._16_8_;
          local_2800._24_8_ = local_29e0._24_8_;
          local_2800._32_8_ = local_2a00._0_8_;
          local_2800._40_8_ = local_2a00._8_8_;
          local_2800._48_8_ = local_2a00._16_8_;
          local_2800._56_8_ = local_2a00._24_8_;
          local_2800.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2a20;
          local_27a0 = local_29c0._0_8_;
          uStack_2798 = local_29c0._8_8_;
          uStack_2790 = local_29c0._16_8_;
          uStack_2788 = local_29c0._24_8_;
          local_2d90.valid = (int *)&local_2680;
          local_2d90.geometryUserPtr = &local_26e0;
          local_2d90.context = local_26c0;
          local_2d90.ray = (RTCRayN *)&local_26a0;
          local_2cc0._0_4_ = *(undefined4 *)((long)&local_2c20 + lVar58 * 4);
          _auStack_2d58 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
          auVar110 = ZEXT1664(auVar106._0_16_);
          auVar116 = ZEXT1664(auVar124._0_16_);
          auVar122 = ZEXT1664(auVar121._0_16_);
          local_2ca0 = auVar94;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2d90,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2800.field_0);
          local_2760._4_4_ = local_2cc0._0_4_;
          local_2760._0_4_ = local_2cc0._0_4_;
          local_2760._8_4_ = local_2cc0._0_4_;
          local_2760._12_4_ = local_2cc0._0_4_;
          local_2760._16_4_ = local_2cc0._0_4_;
          local_2760._20_4_ = local_2cc0._0_4_;
          local_2760._24_4_ = local_2cc0._0_4_;
          local_2760._28_4_ = local_2cc0._0_4_;
          local_2800._0_8_ = local_2680;
          local_2800._8_8_ = uStack_2678;
          local_2800._16_8_ = uStack_2670;
          local_2800._24_8_ = uStack_2668;
          local_2800._32_8_ = local_2660;
          local_2800._40_8_ = uStack_2658;
          local_2800._48_8_ = uStack_2650;
          local_2800._56_8_ = uStack_2648;
          local_2800.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2640;
          local_27a0 = local_26a0._0_8_;
          uStack_2798 = local_26a0._8_8_;
          uStack_2790 = local_26a0._16_8_;
          uStack_2788 = local_26a0._24_8_;
          local_2740 = uVar4;
          uStack_273c = uVar4;
          uStack_2738 = uVar4;
          uStack_2734 = uVar4;
          uStack_2730 = uVar4;
          uStack_272c = uVar4;
          uStack_2728 = uVar4;
          uStack_2724 = uVar4;
          auVar74 = vpcmpeqd_avx2(local_2760,local_2760);
          uStack_271c = local_2db0->user->instID[0];
          local_2720 = uStack_271c;
          uStack_2718 = uStack_271c;
          uStack_2714 = uStack_271c;
          uStack_2710 = uStack_271c;
          uStack_270c = uStack_271c;
          uStack_2708 = uStack_271c;
          uStack_2704 = uStack_271c;
          uStack_26fc = local_2db0->user->instPrimID[0];
          local_2700 = uStack_26fc;
          uStack_26f8 = uStack_26fc;
          uStack_26f4 = uStack_26fc;
          uStack_26f0 = uStack_26fc;
          uStack_26ec = uStack_26fc;
          uStack_26e8 = uStack_26fc;
          uStack_26e4 = uStack_26fc;
          local_2cc0 = *(undefined1 (*) [32])(ray + 0x100);
          auVar94 = vblendvps_avx(local_2cc0,(undefined1  [32])local_26e0,local_2ca0);
          *(undefined1 (*) [32])(ray + 0x100) = auVar94;
          local_2c40 = local_2ca0;
          local_2d90.valid = (int *)local_2c40;
          local_2d90.geometryUserPtr = *(void **)((long)local_2d60 + 0x18);
          local_2d90.context = local_2db0->user;
          local_2d90.hit = (RTCHitN *)&local_2800;
          local_2d90.N = 8;
          local_2d90.ray = (RTCRayN *)ray;
          if (*(code **)((long)local_2d60 + 0x48) != (code *)0x0) {
            auVar110 = ZEXT1664(auVar110._0_16_);
            auVar116 = ZEXT1664(auVar116._0_16_);
            auVar122 = ZEXT1664(auVar122._0_16_);
            (**(code **)((long)local_2d60 + 0x48))(&local_2d90);
            auVar81._8_56_ = extraout_var;
            auVar81._0_8_ = extraout_XMM1_Qa;
            auVar74 = vpcmpeqd_avx2(auVar81._0_32_,auVar81._0_32_);
          }
          unaff_R12 = local_2da0;
          auVar94 = vpcmpeqd_avx2(local_2c40,_DAT_01f7b000);
          auVar78 = auVar74 & ~auVar94;
          auVar125 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar135 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar78 >> 0x7f,0) == '\0') &&
                (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar78 >> 0xbf,0) == '\0') &&
              (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar78[0x1f]) {
            auVar94 = auVar94 ^ auVar74;
          }
          else {
            p_Var6 = local_2db0->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((local_2db0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)((long)local_2d60 + 0x3e) & 0x40) != 0)
                ))) {
              auVar110 = ZEXT1664(auVar110._0_16_);
              auVar116 = ZEXT1664(auVar116._0_16_);
              auVar122 = ZEXT1664(auVar122._0_16_);
              (*p_Var6)(&local_2d90);
              auVar135 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar125 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            auVar74 = vpcmpeqd_avx2(local_2c40,_DAT_01f7b000);
            auVar94 = auVar74 ^ _DAT_01f7b020;
            auVar79._8_4_ = 0xff800000;
            auVar79._0_8_ = 0xff800000ff800000;
            auVar79._12_4_ = 0xff800000;
            auVar79._16_4_ = 0xff800000;
            auVar79._20_4_ = 0xff800000;
            auVar79._24_4_ = 0xff800000;
            auVar79._28_4_ = 0xff800000;
            auVar74 = vblendvps_avx(auVar79,*(undefined1 (*) [32])(local_2d90.ray + 0x100),auVar74);
            *(undefined1 (*) [32])(local_2d90.ray + 0x100) = auVar74;
          }
          auVar74 = vblendvps_avx(local_2cc0,*(undefined1 (*) [32])local_2d98,auVar94);
          *(undefined1 (*) [32])local_2d98 = auVar74;
          uVar56 = local_2da8;
          context = local_2db0;
        }
        auVar74 = vandnps_avx(auVar94,local_2d40);
      }
      lVar58 = lVar58 + 1;
    } while ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar74 >> 0x7f,0) != '\0') ||
               (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar74 >> 0xbf,0) != '\0') ||
             (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar74[0x1f] < '\0');
    auVar81 = ZEXT3264(local_2c80);
    auVar78 = vandps_avx(auVar74,local_2c80);
    lVar51 = local_2cf8 + 1;
    unaff_R12 = unaff_R12 + 0x50;
    auVar74 = local_2c80 & auVar74;
    auVar94 = local_2c80;
    local_2c80 = auVar78;
  } while ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar74 >> 0x7f,0) != '\0') ||
             (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar74 >> 0xbf,0) != '\0') ||
           (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar74[0x1f] < '\0');
  auVar94 = vpcmpeqd_avx2(auVar94,auVar94);
  auVar70._0_4_ = local_2c80._0_4_ ^ auVar94._0_4_;
  auVar70._4_4_ = local_2c80._4_4_ ^ auVar94._4_4_;
  auVar70._8_4_ = local_2c80._8_4_ ^ auVar94._8_4_;
  auVar70._12_4_ = local_2c80._12_4_ ^ auVar94._12_4_;
  auVar70._16_4_ = local_2c80._16_4_ ^ auVar94._16_4_;
  auVar70._20_4_ = local_2c80._20_4_ ^ auVar94._20_4_;
  auVar70._24_4_ = local_2c80._24_4_ ^ auVar94._24_4_;
  auVar70._28_4_ = local_2c80._28_4_ ^ auVar94._28_4_;
  local_2ce0 = vorps_avx(auVar70,local_2ce0);
  auVar94 = auVar94 & ~local_2ce0;
  if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0x7f,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar94 >> 0xbf,0) == '\0') &&
      (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f])
  goto LAB_015ba32a;
  auVar81 = ZEXT3264(local_2a60);
  auVar93._8_4_ = 0xff800000;
  auVar93._0_8_ = 0xff800000ff800000;
  auVar93._12_4_ = 0xff800000;
  auVar93._16_4_ = 0xff800000;
  auVar93._20_4_ = 0xff800000;
  auVar93._24_4_ = 0xff800000;
  auVar93._28_4_ = 0xff800000;
  local_2a60 = vblendvps_avx(local_2a60,auVar93,local_2ce0);
  goto LAB_015b96a1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }